

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall
icu_63::MessagePattern::parseArg
          (MessagePattern *this,int32_t index,int32_t argStartLength,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  int start;
  UBool UVar1;
  char16_t cVar2;
  int32_t index_00;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  Part *pPVar6;
  bool bVar7;
  int32_t length_2;
  int32_t typeIndex;
  UChar c;
  int32_t length_1;
  int32_t length;
  int32_t number;
  int32_t nameIndex;
  UMessagePatternArgType argType;
  int32_t argStart;
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  int32_t nestingLevel_local;
  int32_t argStartLength_local;
  int32_t index_local;
  MessagePattern *this_local;
  
  start = this->partsLength;
  number = 0;
  addPart(this,UMSGPAT_PART_TYPE_ARG_START,index,argStartLength,0,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    index_00 = skipWhiteSpace(this,index + argStartLength);
    iVar3 = UnicodeString::length(&this->msg);
    if (index_00 == iVar3) {
      setParseError(this,parseError,0);
      *errorCode = U_UNMATCHED_BRACES;
      this_local._4_4_ = 0;
    }
    else {
      iVar3 = skipIdentifier(this,index_00);
      iVar4 = parseArgNumber(this,index_00,iVar3);
      if (iVar4 < 0) {
        if (iVar4 != -1) {
          setParseError(this,parseError,index_00);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          return 0;
        }
        if (0xffff < iVar3 - index_00) {
          setParseError(this,parseError,index_00);
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        this->hasArgNames = '\x01';
        addPart(this,UMSGPAT_PART_TYPE_ARG_NAME,index_00,iVar3 - index_00,0,errorCode);
      }
      else {
        if ((0xffff < iVar3 - index_00) || (0x7fff < iVar4)) {
          setParseError(this,parseError,index_00);
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        this->hasArgNumbers = '\x01';
        addPart(this,UMSGPAT_PART_TYPE_ARG_NUMBER,index_00,iVar3 - index_00,iVar4,errorCode);
      }
      nestingLevel_local = skipWhiteSpace(this,iVar3);
      iVar3 = UnicodeString::length(&this->msg);
      if (nestingLevel_local == iVar3) {
        setParseError(this,parseError,0);
        *errorCode = U_UNMATCHED_BRACES;
        this_local._4_4_ = 0;
      }
      else {
        cVar2 = UnicodeString::charAt(&this->msg,nestingLevel_local);
        if (cVar2 != L'}') {
          if (cVar2 != L',') {
            setParseError(this,parseError,index_00);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
            return 0;
          }
          iVar3 = skipWhiteSpace(this,nestingLevel_local + 1);
          nestingLevel_local = iVar3;
          while( true ) {
            iVar4 = UnicodeString::length(&this->msg);
            bVar7 = false;
            if (nestingLevel_local < iVar4) {
              cVar2 = UnicodeString::charAt(&this->msg,nestingLevel_local);
              UVar1 = isArgTypeChar((uint)(ushort)cVar2);
              bVar7 = UVar1 != '\0';
            }
            if (!bVar7) break;
            nestingLevel_local = nestingLevel_local + 1;
          }
          iVar5 = nestingLevel_local - iVar3;
          nestingLevel_local = skipWhiteSpace(this,nestingLevel_local);
          iVar4 = UnicodeString::length(&this->msg);
          if (nestingLevel_local == iVar4) {
            setParseError(this,parseError,0);
            *errorCode = U_UNMATCHED_BRACES;
            return 0;
          }
          if ((iVar5 == 0) ||
             ((cVar2 = UnicodeString::charAt(&this->msg,nestingLevel_local), cVar2 != L',' &&
              (cVar2 != L'}')))) {
            setParseError(this,parseError,index_00);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
            return 0;
          }
          if (0xffff < iVar5) {
            setParseError(this,parseError,index_00);
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          number = 1;
          if (iVar5 == 6) {
            UVar1 = isChoice(this,iVar3);
            if (UVar1 == '\0') {
              UVar1 = isPlural(this,iVar3);
              if (UVar1 == '\0') {
                UVar1 = isSelect(this,iVar3);
                if (UVar1 != '\0') {
                  number = 4;
                }
              }
              else {
                number = 3;
              }
            }
            else {
              number = 2;
            }
          }
          else if (((iVar5 == 0xd) && (UVar1 = isSelect(this,iVar3), UVar1 != '\0')) &&
                  (UVar1 = isOrdinal(this,iVar3 + 6), UVar1 != '\0')) {
            number = 5;
          }
          pPVar6 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::operator[]
                             ((MaybeStackArray<icu_63::MessagePattern::Part,_32> *)this->partsList,
                              (long)start);
          pPVar6->value = (int16_t)number;
          if (number == 1) {
            addPart(this,UMSGPAT_PART_TYPE_ARG_TYPE,iVar3,iVar5,0,errorCode);
          }
          if (cVar2 == L'}') {
            if (number != 1) {
              setParseError(this,parseError,index_00);
              *errorCode = U_PATTERN_SYNTAX_ERROR;
              return 0;
            }
          }
          else {
            iVar5 = nestingLevel_local + 1;
            if (number == 1) {
              nestingLevel_local = parseSimpleStyle(this,iVar5,parseError,errorCode);
            }
            else if (number == 2) {
              nestingLevel_local = parseChoiceStyle(this,iVar5,nestingLevel,parseError,errorCode);
            }
            else {
              nestingLevel_local =
                   parsePluralOrSelectStyle(this,number,iVar5,nestingLevel,parseError,errorCode);
            }
          }
        }
        addLimitPart(this,start,UMSGPAT_PART_TYPE_ARG_LIMIT,nestingLevel_local,1,number,errorCode);
        this_local._4_4_ = nestingLevel_local + 1;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
MessagePattern::parseArg(int32_t index, int32_t argStartLength, int32_t nestingLevel,
                         UParseError *parseError, UErrorCode &errorCode) {
    int32_t argStart=partsLength;
    UMessagePatternArgType argType=UMSGPAT_ARG_TYPE_NONE;
    addPart(UMSGPAT_PART_TYPE_ARG_START, index, argStartLength, argType, errorCode);
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t nameIndex=index=skipWhiteSpace(index+argStartLength);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    // parse argument name or number
    index=skipIdentifier(index);
    int32_t number=parseArgNumber(nameIndex, index);
    if(number>=0) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH || number>Part::MAX_VALUE) {
            setParseError(parseError, nameIndex);  // Argument number too large.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNumbers=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NUMBER, nameIndex, length, number, errorCode);
    } else if(number==UMSGPAT_ARG_NAME_NOT_NUMBER) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNames=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NAME, nameIndex, length, 0, errorCode);
    } else {  // number<-1 (ARG_NAME_NOT_VALID)
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    index=skipWhiteSpace(index);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    UChar c=msg.charAt(index);
    if(c==u_rightCurlyBrace) {
        // all done
    } else if(c!=u_comma) {
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    } else /* ',' */ {
        // parse argument type: case-sensitive a-zA-Z
        int32_t typeIndex=index=skipWhiteSpace(index+1);
        while(index<msg.length() && isArgTypeChar(msg.charAt(index))) {
            ++index;
        }
        int32_t length=index-typeIndex;
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, 0);  // Unmatched '{' braces in message.
            errorCode=U_UNMATCHED_BRACES;
            return 0;
        }
        if(length==0 || ((c=msg.charAt(index))!=u_comma && c!=u_rightCurlyBrace)) {
            setParseError(parseError, nameIndex);  // Bad argument syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument type name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        argType=UMSGPAT_ARG_TYPE_SIMPLE;
        if(length==6) {
            // case-insensitive comparisons for complex-type names
            if(isChoice(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_CHOICE;
            } else if(isPlural(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_PLURAL;
            } else if(isSelect(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_SELECT;
            }
        } else if(length==13) {
            if(isSelect(typeIndex) && isOrdinal(typeIndex+6)) {
                argType=UMSGPAT_ARG_TYPE_SELECTORDINAL;
            }
        }
        // change the ARG_START type from NONE to argType
        partsList->a[argStart].value=(int16_t)argType;
        if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
            addPart(UMSGPAT_PART_TYPE_ARG_TYPE, typeIndex, length, 0, errorCode);
        }
        // look for an argument style (pattern)
        if(c==u_rightCurlyBrace) {
            if(argType!=UMSGPAT_ARG_TYPE_SIMPLE) {
                setParseError(parseError, nameIndex);  // No style field for complex argument.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
        } else /* ',' */ {
            ++index;
            if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
                index=parseSimpleStyle(index, parseError, errorCode);
            } else if(argType==UMSGPAT_ARG_TYPE_CHOICE) {
                index=parseChoiceStyle(index, nestingLevel, parseError, errorCode);
            } else {
                index=parsePluralOrSelectStyle(argType, index, nestingLevel, parseError, errorCode);
            }
        }
    }
    // Argument parsing stopped on the '}'.
    addLimitPart(argStart, UMSGPAT_PART_TYPE_ARG_LIMIT, index, 1, argType, errorCode);
    return index+1;
}